

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetDefaultFieldValuePrinter
          (Printer *this,FieldValuePrinter *printer)

{
  unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
  local_20;
  FieldValuePrinter *local_18;
  FieldValuePrinter *printer_local;
  Printer *this_local;
  
  local_18 = printer;
  printer_local = (FieldValuePrinter *)this;
  std::
  make_unique<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,google::protobuf::TextFormat::FieldValuePrinter_const*&>
            ((FieldValuePrinter **)&local_20);
  std::
  unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>
  ::operator=((unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>
               *)&this->default_field_value_printer_,&local_20);
  std::
  unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void TextFormat::Printer::SetDefaultFieldValuePrinter(
    const FieldValuePrinter* printer) {
  default_field_value_printer_ =
      std::make_unique<FieldValuePrinterWrapper>(printer);
}